

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

void __thiscall soul::ValuePrinter::printFloat32(ValuePrinter *this,float value)

{
  long lVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  long *plVar2;
  long *plVar3;
  char *pcVar4;
  ulong uVar5;
  long *local_88;
  long local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  long *local_68 [2];
  long local_58 [2];
  char local_48 [32];
  char *local_28;
  
  if ((value != 0.0) || (NAN(value))) {
    if (NAN(value)) {
      UNRECOVERED_JUMPTABLE = this->_vptr_ValuePrinter[0x13];
      pcVar4 = "_nan32";
      uVar5 = 6;
    }
    else {
      if (ABS(value) != INFINITY) {
        local_28 = choc::text::FloatToStringBuffer<float>::writeAndGetEnd(local_48,value,-1);
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_48,local_28);
        plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_78 = *plVar3;
          uStack_70 = (undefined4)plVar2[3];
          uStack_6c = *(undefined4 *)((long)plVar2 + 0x1c);
          local_88 = &local_78;
        }
        else {
          local_78 = *plVar3;
          local_88 = (long *)*plVar2;
        }
        lVar1 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        (*this->_vptr_ValuePrinter[0x13])(this,lVar1,local_88);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
        return;
      }
      pcVar4 = "_ninf32";
      if (0.0 < value) {
        pcVar4 = "_inf32";
      }
      uVar5 = (ulong)(0.0 < value) ^ 7;
      UNRECOVERED_JUMPTABLE = this->_vptr_ValuePrinter[0x13];
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = this->_vptr_ValuePrinter[0x13];
    pcVar4 = "0";
    uVar5 = 1;
  }
  (*UNRECOVERED_JUMPTABLE)(this,uVar5,pcVar4);
  return;
}

Assistant:

void ValuePrinter::printFloat32 (float value)
{
    if (value == 0)             return print ("0");
    if (std::isnan (value))     return print ("_nan32");
    if (std::isinf (value))     return print (value > 0 ? "_inf32" : "_ninf32");

    return print (choc::text::floatToString (value) + "f");
}